

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

ConstIterator __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::find(ChannelGroupManifest *this,uint64_t idValue)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  const_iterator cVar3;
  
  cVar2._M_node = &(this->_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  cVar3._M_node = cVar2._M_node;
  for (p_Var1 = (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < idValue]) {
    if (*(ulong *)(p_Var1 + 1) >= idValue) {
      cVar3._M_node = p_Var1;
    }
  }
  if ((cVar3._M_node != cVar2._M_node) && (*(ulong *)(cVar3._M_node + 1) <= idValue)) {
    cVar2._M_node = cVar3._M_node;
  }
  return (ConstIterator)cVar2._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::ConstIterator
IDManifest::ChannelGroupManifest::find (uint64_t idValue) const
{
    return IDManifest::ChannelGroupManifest::ConstIterator (
        _table.find (idValue));
}